

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild.cpp
# Opt level: O3

int FNodeBuilder::SortSegs(void *a,void *b)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  lVar1 = *a;
  lVar2 = *b;
  iVar5 = *(int *)(lVar1 + 0xc);
  uVar6 = 2;
  uVar4 = 2;
  if (iVar5 != -1) {
    uVar4 = (uint)(*(long *)(lVar1 + 0x10) == *(long *)(lVar1 + 0x18));
  }
  if (*(int *)(lVar2 + 0xc) != -1) {
    uVar6 = (uint)(*(long *)(lVar2 + 0x10) == *(long *)(lVar2 + 0x18));
  }
  iVar3 = 0;
  if (iVar5 != -1) {
    iVar3 = iVar5 - *(int *)(lVar2 + 0xc);
  }
  iVar5 = uVar4 - uVar6;
  if (uVar4 - uVar6 == 0) {
    iVar5 = iVar3;
  }
  return iVar5;
}

Assistant:

int FNodeBuilder::SortSegs (const void *a, const void *b)
{
	const FPrivSeg *x = ((const USegPtr *)a)->SegPtr;
	const FPrivSeg *y = ((const USegPtr *)b)->SegPtr;

	// Segs are grouped into three categories in this order:
	//
	// 1. Segs with different front and back sectors (or no back at all).
	// 2. Segs with the same front and back sectors.
	// 3. Minisegs.
	//
	// Within the first two sets, segs are also sorted by linedef.
	//
	// Note that when GL subsectors are written, the segs will be reordered
	// so that they are in clockwise order, and extra minisegs will be added
	// as needed to close the subsector. But the first seg used will still be
	// the first seg chosen here.

	int xtype, ytype;

	if (x->linedef == -1)
	{
		xtype = 2;
	}
	else if (x->frontsector == x->backsector)
	{
		xtype = 1;
	}
	else
	{
		xtype = 0;
	}

	if (y->linedef == -1)
	{
		ytype = 2;
	}
	else if (y->frontsector == y->backsector)
	{
		ytype = 1;
	}
	else
	{
		ytype = 0;
	}

	if (xtype != ytype)
	{
		return xtype - ytype;
	}
	else if (xtype < 2)
	{
		return x->linedef - y->linedef;
	}
	else
	{
		return 0;
	}
}